

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_statement.cpp
# Opt level: O1

string * __thiscall
duckdb::DeleteStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,DeleteStatement *this)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  pointer pTVar1;
  const_reference this_01;
  pointer pPVar2;
  long *plVar3;
  const_reference pvVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  size_type __n;
  size_type __n_00;
  string column;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CommonTableExpressionMap::ToString_abi_cxx11_(&local_b0,&this->cte_map);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pTVar1 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                     (&this->table);
  (*pTVar1->_vptr_TableRef[2])(&local_b0,pTVar1);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((this->using_clauses).
      super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->using_clauses).
      super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->using_clauses).
        super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->using_clauses).
        super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        if (__n != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        this_01 = vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_true>
                  ::operator[](&this->using_clauses,__n);
        pTVar1 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                 operator->(this_01);
        (*pTVar1->_vptr_TableRef[2])(&local_b0,pTVar1);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->using_clauses).
                                   super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->using_clauses).
                                   super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_90);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1e29c58);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = &this->returning_list;
      __n_00 = 0;
      do {
        if (__n_00 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](this_00,__n_00);
        pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar4);
        (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pPVar2);
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](this_00,__n_00);
        pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar4);
        if ((pPVar2->super_BaseExpression).alias._M_string_length != 0) {
          local_70[0] = local_60;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70," AS %s","");
          pvVar4 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::operator[](this_00,__n_00);
          pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(pvVar4);
          params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_00000001;
          KeywordHelper::WriteOptionallyQuoted
                    (&local_50,&(pPVar2->super_BaseExpression).alias,'\"',true);
          StringUtil::Format<std::__cxx11::string>
                    (&local_90,(StringUtil *)local_70,&local_50,params);
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
        }
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)(this->returning_list).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->returning_list).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DeleteStatement::ToString() const {
	string result;
	result = cte_map.ToString();
	result += "DELETE FROM ";
	result += table->ToString();
	if (!using_clauses.empty()) {
		result += " USING ";
		for (idx_t i = 0; i < using_clauses.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			result += using_clauses[i]->ToString();
		}
	}
	if (condition) {
		result += " WHERE " + condition->ToString();
	}

	if (!returning_list.empty()) {
		result += " RETURNING ";
		for (idx_t i = 0; i < returning_list.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			auto column = returning_list[i]->ToString();
			if (!returning_list[i]->GetAlias().empty()) {
				column +=
				    StringUtil::Format(" AS %s", KeywordHelper::WriteOptionallyQuoted(returning_list[i]->GetAlias()));
			}
			result += column;
		}
	}
	return result;
}